

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall
ManySubcommands_Required1Fuzzy_Test::~ManySubcommands_Required1Fuzzy_Test
          (ManySubcommands_Required1Fuzzy_Test *this)

{
  ManySubcommands_Required1Fuzzy_Test *this_local;
  
  ~ManySubcommands_Required1Fuzzy_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(ManySubcommands, Required1Fuzzy) {

    app.require_subcommand(0, 1);

    run();
    EXPECT_EQ(sub1->remaining(), vs_t({"sub2", "sub3"}));

    app.reset();
    app.require_subcommand(-1);

    run();
    EXPECT_EQ(sub1->remaining(), vs_t({"sub2", "sub3"}));
}